

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

void ParseConstant(FScanner *sc,PSymbolTable *symt,PClassActor *cls)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FxExpression *pFVar4;
  PSymbolConstNumeric *this;
  PSymbol *pPVar5;
  char *pcVar6;
  double dVar7;
  FName symname;
  ExpVal val;
  FName local_30;
  FName local_2c;
  
  bVar1 = FScanner::CheckToken(sc,0x13a);
  if ((bVar1) || (bVar1 = FScanner::CheckToken(sc,0x133), bVar1)) {
    iVar3 = sc->TokenType;
    FScanner::MustGetToken(sc,0x101);
    FName::FName(&symname,sc->String);
    FScanner::MustGetToken(sc,0x3d);
    pFVar4 = ParseExpression(sc,cls,true);
    FScanner::MustGetToken(sc,0x3b);
    if (pFVar4 == (FxExpression *)0x0) {
      pcVar6 = "Error while resolving constant definition";
    }
    else {
      iVar2 = (*pFVar4->_vptr_FxExpression[3])(pFVar4);
      if ((char)iVar2 != '\0') {
        ExpVal::ExpVal(&val,(ExpVal *)(pFVar4 + 1));
        (*pFVar4->_vptr_FxExpression[1])(pFVar4);
        if (iVar3 == 0x13a) {
          this = (PSymbolConstNumeric *)DObject::operator_new(0x38);
          local_2c.Index = symname.Index;
          PSymbolConstNumeric::PSymbolConstNumeric(this,&local_2c,(PType *)TypeSInt32);
          iVar3 = ExpVal::GetInt(&val);
          (this->field_0).Value = iVar3;
        }
        else {
          this = (PSymbolConstNumeric *)DObject::operator_new(0x38);
          local_30.Index = symname.Index;
          PSymbolConstNumeric::PSymbolConstNumeric(this,&local_30,(PType *)TypeFloat64);
          dVar7 = ExpVal::GetFloat(&val);
          (this->field_0).Float = dVar7;
        }
        pPVar5 = PSymbolTable::AddSymbol(symt,(PSymbol *)this);
        if (pPVar5 == (PSymbol *)0x0) {
          (*(this->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject[2])(this);
          if (cls == (PClassActor *)0x0) {
            pcVar6 = "Global";
          }
          else {
            pcVar6 = FName::NameData.NameArray
                     [(cls->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
          }
          FScanner::ScriptMessage
                    (sc,"\'%s\' is already defined in \'%s\'.",
                     FName::NameData.NameArray[symname.Index].Text,pcVar6);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        ExpVal::~ExpVal(&val);
        return;
      }
      pcVar6 = "Constant definition is not a constant";
    }
  }
  else {
    pcVar6 = "Numeric type required for constant";
  }
  FScanner::ScriptMessage(sc,pcVar6);
  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  return;
}

Assistant:

static void ParseConstant (FScanner &sc, PSymbolTable *symt, PClassActor *cls)
{
	// Read the type and make sure it's int or float.
	if (sc.CheckToken(TK_Int) || sc.CheckToken(TK_Float))
	{
		int type = sc.TokenType;
		sc.MustGetToken(TK_Identifier);
		FName symname = sc.String;
		sc.MustGetToken('=');
		FxExpression *expr = ParseExpression (sc, cls, true);
		sc.MustGetToken(';');

		if (expr == nullptr)
		{
			sc.ScriptMessage("Error while resolving constant definition");
			FScriptPosition::ErrorCounter++;
		}
		else if (!expr->isConstant())
		{
			sc.ScriptMessage("Constant definition is not a constant");
			FScriptPosition::ErrorCounter++;
		}
		else
		{
			ExpVal val = static_cast<FxConstant *>(expr)->GetValue();
			delete expr;
			PSymbolConstNumeric *sym;
			if (type == TK_Int)
			{
				sym = new PSymbolConstNumeric(symname, TypeSInt32);
				sym->Value = val.GetInt();
			}
			else
			{
				sym = new PSymbolConstNumeric(symname, TypeFloat64);
				sym->Float = val.GetFloat();
			}
			if (symt->AddSymbol (sym) == NULL)
			{
				delete sym;
				sc.ScriptMessage ("'%s' is already defined in '%s'.",
					symname.GetChars(), cls? cls->TypeName.GetChars() : "Global");
				FScriptPosition::ErrorCounter++;
			}
		}
	}
	else
	{
		sc.ScriptMessage("Numeric type required for constant");
		FScriptPosition::ErrorCounter++;
	}
}